

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuUtils.cpp
# Opt level: O0

void solveTSPRoute(Graph<std::pair<double,_double>_> *graph,UI *ui,int *start_node,int *end_node,
                  vector<int,_std::allocator<int>_> *POIs)

{
  ostream *poVar1;
  rep rVar2;
  bool bVar3;
  double dVar4;
  anon_class_8_1_ba1d6a41 local_508;
  function<void_()> local_500;
  allocator local_4d9;
  string local_4d8 [32];
  anon_class_24_3_95090717 local_4b8;
  function<void_()> local_4a0;
  allocator local_479;
  string local_478 [39];
  anon_class_1_0_00000001 local_451;
  function<void_()> local_450;
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [32];
  undefined1 local_3e0 [8];
  Menu showMenu;
  duration<long,_std::ratio<1L,_1000000L>_> local_398;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> duration;
  time_point stop;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_368;
  time_point start;
  anon_class_56_7_d0bbad54 local_358;
  function<void_()> local_320;
  allocator local_2f9;
  string local_2f8 [32];
  anon_class_56_7_d0bbad54 local_2d8;
  function<void_()> local_2a0;
  allocator local_279;
  string local_278 [32];
  anon_class_56_7_d0bbad54 local_258;
  function<void_()> local_220;
  allocator local_1f9;
  string local_1f8 [32];
  anon_class_56_7_d0bbad54 local_1d8;
  function<void_()> local_1a0;
  allocator local_179;
  string local_178 [32];
  anon_class_8_1_4f9e1fb8 local_158;
  function<void_()> local_150;
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [32];
  undefined1 local_e0 [8];
  Menu algorithmSelector;
  undefined1 local_98 [7];
  bool cancel;
  vector<int,_std::allocator<int>_> ord;
  undefined1 local_70 [8];
  Path path;
  function<Path_()> tsp_algorithm;
  vector<int,_std::allocator<int>_> *POIs_local;
  int *end_node_local;
  int *start_node_local;
  UI *ui_local;
  Graph<std::pair<double,_double>_> *graph_local;
  
  std::function<Path_()>::function
            ((function<Path_()> *)
             &path.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Path::Path((Path *)local_70);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_98);
  algorithmSelector._63_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"Select algorithm",&local_101);
  Menu::Menu((Menu *)local_e0,(string *)local_100,false);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"Cancel",&local_129);
  local_158.cancel = (bool *)&algorithmSelector.field_0x3f;
  std::function<void()>::
  function<solveTSPRoute(Graph<std::pair<double,double>>&,UI&,int_const&,int_const&,std::vector<int,std::allocator<int>>&)::__0,void>
            ((function<void()> *)&local_150,&local_158);
  Menu::addOption((Menu *)local_e0,(string *)local_128,&local_150);
  std::function<void_()>::~function(&local_150);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"Nearest-neighbor",&local_179);
  local_1d8.tsp_algorithm =
       (function<Path_()> *)
       &path.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  local_1d8.ord = (vector<int,_std::allocator<int>_> *)local_98;
  local_1d8.path = (Path *)local_70;
  local_1d8.graph = graph;
  local_1d8.start_node = start_node;
  local_1d8.end_node = end_node;
  local_1d8.POIs = POIs;
  std::function<void()>::
  function<solveTSPRoute(Graph<std::pair<double,double>>&,UI&,int_const&,int_const&,std::vector<int,std::allocator<int>>&)::__1,void>
            ((function<void()> *)&local_1a0,&local_1d8);
  Menu::addOption((Menu *)local_e0,(string *)local_178,&local_1a0);
  std::function<void_()>::~function(&local_1a0);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"Nearest-neighbor 2-opt",&local_1f9);
  local_258.tsp_algorithm =
       (function<Path_()> *)
       &path.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  local_258.ord = (vector<int,_std::allocator<int>_> *)local_98;
  local_258.path = (Path *)local_70;
  local_258.graph = graph;
  local_258.start_node = start_node;
  local_258.end_node = end_node;
  local_258.POIs = POIs;
  std::function<void()>::
  function<solveTSPRoute(Graph<std::pair<double,double>>&,UI&,int_const&,int_const&,std::vector<int,std::allocator<int>>&)::__2,void>
            ((function<void()> *)&local_220,&local_258);
  Menu::addOption((Menu *)local_e0,(string *)local_1f8,&local_220);
  std::function<void_()>::~function(&local_220);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"Randomized NN",&local_279);
  local_2d8.tsp_algorithm =
       (function<Path_()> *)
       &path.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  local_2d8.ord = (vector<int,_std::allocator<int>_> *)local_98;
  local_2d8.path = (Path *)local_70;
  local_2d8.graph = graph;
  local_2d8.start_node = start_node;
  local_2d8.end_node = end_node;
  local_2d8.POIs = POIs;
  std::function<void()>::
  function<solveTSPRoute(Graph<std::pair<double,double>>&,UI&,int_const&,int_const&,std::vector<int,std::allocator<int>>&)::__3,void>
            ((function<void()> *)&local_2a0,&local_2d8);
  Menu::addOption((Menu *)local_e0,(string *)local_278,&local_2a0);
  std::function<void_()>::~function(&local_2a0);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"Randomized NN 2-opt",&local_2f9);
  local_358.tsp_algorithm =
       (function<Path_()> *)
       &path.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  local_358.ord = (vector<int,_std::allocator<int>_> *)local_98;
  local_358.path = (Path *)local_70;
  local_358.graph = graph;
  local_358.start_node = start_node;
  local_358.end_node = end_node;
  local_358.POIs = POIs;
  std::function<void()>::
  function<solveTSPRoute(Graph<std::pair<double,double>>&,UI&,int_const&,int_const&,std::vector<int,std::allocator<int>>&)::__4,void>
            ((function<void()> *)&local_320,&local_358);
  Menu::addOption((Menu *)local_e0,(string *)local_2f8,&local_320);
  std::function<void_()>::~function(&local_320);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  Menu::start((Menu *)local_e0);
  bVar3 = (algorithmSelector._63_1_ & 1) == 0;
  if (bVar3) {
    local_368.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    std::function<Path_()>::operator()
              ((Path *)&stop,
               (function<Path_()> *)
               &path.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    Path::operator=((Path *)local_70,(Path *)&stop);
    Path::~Path((Path *)&stop);
    duration.__r = std::chrono::_V2::system_clock::now();
    showMenu._56_8_ =
         std::chrono::operator-
                   ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)&duration,&local_368);
    local_398.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)&showMenu.persistent);
    poVar1 = std::operator<<((ostream *)&std::cout,"Size: ");
    dVar4 = Path::getLength((Path *)local_70);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar4);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Time to pathfind (micro): ");
    rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_398);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_400,"Show path?",&local_401);
    Menu::Menu((Menu *)local_3e0,(string *)local_400,false);
    std::__cxx11::string::~string(local_400);
    std::allocator<char>::~allocator((allocator<char> *)&local_401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_428,"No",&local_429);
    std::function<void()>::
    function<solveTSPRoute(Graph<std::pair<double,double>>&,UI&,int_const&,int_const&,std::vector<int,std::allocator<int>>&)::__5,void>
              ((function<void()> *)&local_450,&local_451);
    Menu::addOption((Menu *)local_3e0,(string *)local_428,&local_450);
    std::function<void_()>::~function(&local_450);
    std::__cxx11::string::~string(local_428);
    std::allocator<char>::~allocator((allocator<char> *)&local_429);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_478,"Yes, in GraphViewer",&local_479);
    local_4b8.path = (Path *)local_70;
    local_4b8.ord = (vector<int,_std::allocator<int>_> *)local_98;
    local_4b8.ui = ui;
    std::function<void()>::
    function<solveTSPRoute(Graph<std::pair<double,double>>&,UI&,int_const&,int_const&,std::vector<int,std::allocator<int>>&)::__6,void>
              ((function<void()> *)&local_4a0,&local_4b8);
    Menu::addOption((Menu *)local_3e0,(string *)local_478,&local_4a0);
    std::function<void_()>::~function(&local_4a0);
    std::__cxx11::string::~string(local_478);
    std::allocator<char>::~allocator((allocator<char> *)&local_479);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4d8,"Yes, in console",&local_4d9);
    local_508.ord = (vector<int,_std::allocator<int>_> *)local_98;
    std::function<void()>::
    function<solveTSPRoute(Graph<std::pair<double,double>>&,UI&,int_const&,int_const&,std::vector<int,std::allocator<int>>&)::__7,void>
              ((function<void()> *)&local_500,&local_508);
    Menu::addOption((Menu *)local_3e0,(string *)local_4d8,&local_500);
    std::function<void_()>::~function(&local_500);
    std::__cxx11::string::~string(local_4d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
    Menu::start((Menu *)local_3e0);
    Menu::~Menu((Menu *)local_3e0);
  }
  start.__d.__r._5_3_ = 0;
  start.__d.__r._4_1_ = !bVar3;
  Menu::~Menu((Menu *)local_e0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_98);
  Path::~Path((Path *)local_70);
  std::function<Path_()>::~function
            ((function<Path_()> *)
             &path.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void solveTSPRoute(Graph<coordinates> &graph, UI &ui, const int &start_node, const int &end_node, vector<int> &POIs) {
    function<Path ()> tsp_algorithm;
    Path path;
    vector<int> ord;
    bool cancel = false;

    Menu algorithmSelector("Select algorithm", false);
    algorithmSelector.addOption("Cancel", [&](){ cancel = true; });
    algorithmSelector.addOption("Nearest-neighbor", [&](){ tsp_algorithm = [&](){ return graph.nearestNeighborsSearch(start_node, end_node, POIs, ord, path); }; });
    algorithmSelector.addOption("Nearest-neighbor 2-opt", [&](){ tsp_algorithm = [&](){ graph.nearestNeighborsSearch(start_node, end_node, POIs, ord, path); return graph.twoOpt(ord, path); }; });
    algorithmSelector.addOption("Randomized NN", [&](){ tsp_algorithm = [&](){ return graph.RNNeighborsSearch(start_node, end_node, POIs, ord, path, 3); }; });
    algorithmSelector.addOption("Randomized NN 2-opt", [&](){ tsp_algorithm = [&](){ graph.RNNeighborsSearch(start_node, end_node, POIs, ord, path, 3); return graph.twoOpt(ord, path); }; });
    algorithmSelector.start();
    if (cancel) { return; }

    auto start = high_resolution_clock::now();
    path = tsp_algorithm();
    auto stop = high_resolution_clock::now();
    auto duration = duration_cast<microseconds>(stop - start);

    cout << "Size: " << path.getLength() << endl;
    cout << "Time to pathfind (micro): " << duration.count() << endl;

    Menu showMenu("Show path?", false);
    showMenu.addOption("No", EXIT);
    showMenu.addOption("Yes, in GraphViewer", [&](){ ui.showDeliveryPath(path.getPath(), ord); });
    showMenu.addOption("Yes, in console", [&](){ printPath(ord); enterWait(); });
    showMenu.start();
}